

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O2

void set_set(t_set *x,t_symbol *templatesym,t_symbol *field)

{
  t_setvariable *ptVar1;
  t_symbol *ptVar2;
  
  if (x->x_nin == 1) {
    ptVar2 = template_getbindsym(templatesym);
    x->x_templatesym = ptVar2;
    ptVar1 = x->x_variables;
    ptVar1->gv_sym = field;
    if (x->x_issymbol == 0) {
      (ptVar1->gv_w).w_float = 0.0;
    }
    else {
      (ptVar1->gv_w).w_symbol = &s_;
    }
    return;
  }
  pd_error(x,"set: cannot set multiple fields.");
  return;
}

Assistant:

static void set_set(t_set *x, t_symbol *templatesym, t_symbol *field)
{
    if (x->x_nin != 1)
        pd_error(x, "set: cannot set multiple fields.");
    else
    {
       x->x_templatesym = template_getbindsym(templatesym);
       x->x_variables->gv_sym = field;
       if (x->x_issymbol)
           x->x_variables->gv_w.w_symbol = &s_;
       else
           x->x_variables->gv_w.w_float = 0;
    }
}